

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool list_iterator(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_fiber_t *fiber;
  ulong uVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  gravity_class_t *pgVar3;
  gravity_class_t *pgVar4;
  gravity_value_t value;
  gravity_value_t value_00;
  char _buffer [4096];
  char local_1018 [4096];
  
  uVar1 = (ulong)*(uint *)&((args->field_1).p)->objclass;
  pgVar3 = gravity_class_bool;
  if ((uVar1 != 0) &&
     ((args[1].isa != gravity_class_null || (pgVar3 = gravity_class_int, args[1].field_1.n != 0))))
  {
    if (args[1].isa != gravity_class_int) {
      builtin_strncpy(local_1018,"Iterator expects a numeric value here.",0x27);
      fiber = gravity_vm_fiber(vm);
      gravity_fiber_seterror(fiber,local_1018);
      value.field_1.n = 0;
      value.isa = gravity_class_null;
      gravity_vm_setslot(vm,value,rindex);
      return false;
    }
    aVar2.p = (gravity_object_t *)((long)&(args[1].field_1.p)->isa + 1);
    pgVar4 = gravity_class_int;
    pgVar3 = gravity_class_bool;
    if (aVar2.n < (long)uVar1) goto LAB_00119a35;
  }
  aVar2.n = 0;
  pgVar4 = pgVar3;
LAB_00119a35:
  value_00.field_1.n = aVar2.n;
  value_00.isa = pgVar4;
  gravity_vm_setslot(vm,value_00,rindex);
  return true;
}

Assistant:

static bool list_iterator (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_list_t *list = VALUE_AS_LIST(GET_VALUE(0));

    // check for empty list first
    register uint32_t count = (uint32_t)marray_size(list->array);
    if (count == 0) RETURN_VALUE(VALUE_FROM_FALSE, rindex);

    // check for start of iteration
    if (VALUE_ISA_NULL(GET_VALUE(1))) RETURN_VALUE(VALUE_FROM_INT(0), rindex);

    // extract value
    gravity_value_t value = GET_VALUE(1);

    // check error condition
    if (!VALUE_ISA_INT(value)) RETURN_ERROR("Iterator expects a numeric value here.");

    // compute new value
    gravity_int_t n = value.n;
    if (n+1 < count) {
        ++n;
    } else {
        RETURN_VALUE(VALUE_FROM_FALSE, rindex);
    }

    // return new iterator
    RETURN_VALUE(VALUE_FROM_INT(n), rindex);
}